

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idruptracer.cpp
# Opt level: O0

void __thiscall CaDiCaL::IdrupTracer::put_binary_id(IdrupTracer *this,uint64_t id)

{
  File *in_RSI;
  uchar ch;
  uint64_t x;
  
  for (; ((ulong)in_RSI & 0xffffffffffffff80) != 0; in_RSI = (File *)((ulong)in_RSI >> 7)) {
    File::put(in_RSI,(byte)in_RSI & 0x7f | 0x80);
  }
  File::put(in_RSI,(byte)in_RSI);
  return;
}

Assistant:

inline void IdrupTracer::put_binary_id (uint64_t id) {
  assert (binary);
  assert (file);
  uint64_t x = id;
  unsigned char ch;
  while (x & ~0x7f) {
    ch = (x & 0x7f) | 0x80;
    file->put (ch);
    x >>= 7;
  }
  ch = x;
  file->put (ch);
}